

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::getIis(Highs *this,HighsIis *iis)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  HighsModelStatus model_status;
  undefined3 uVar1;
  HighsInt HVar2;
  HighsStatus call_status;
  HighsStatus HVar3;
  string local_b8;
  HighsLogOptions local_98;
  
  model_status = this->model_status_;
  HVar3 = kOk;
  if ((int)model_status < 8) {
    HVar3 = kOk;
    if (model_status == kMin) goto LAB_0020c190;
    if (model_status == kOptimal) {
LAB_0020c161:
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Calling Highs::getIis for a model that is known to be feasible\n");
      HighsIis::invalidate(iis);
      iis->valid_ = true;
      return kOk;
    }
  }
  else {
    if (model_status == kInfeasible) goto LAB_0020c190;
    if (model_status == kUnbounded) goto LAB_0020c161;
  }
  utilModelStatusToString_abi_cxx11_(&local_b8,model_status);
  highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kWarning,
               "Calling Highs::getIis for a model with status %s\n",local_b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  HVar3 = kWarning;
LAB_0020c190:
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_98.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  call_status = getIisInterface(this);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"getIisInterface","");
  HVar3 = interpretCallStatus(&local_98,call_status,HVar3,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  uVar1 = *(undefined3 *)&(this->iis_).field_0x1;
  HVar2 = (this->iis_).strategy_;
  iis->valid_ = (this->iis_).valid_;
  *(undefined3 *)&iis->field_0x1 = uVar1;
  iis->strategy_ = HVar2;
  std::vector<int,_std::allocator<int>_>::operator=(&iis->col_index_,&(this->iis_).col_index_);
  std::vector<int,_std::allocator<int>_>::operator=(&iis->row_index_,&(this->iis_).row_index_);
  std::vector<int,_std::allocator<int>_>::operator=(&iis->col_bound_,&(this->iis_).col_bound_);
  std::vector<int,_std::allocator<int>_>::operator=(&iis->row_bound_,&(this->iis_).row_bound_);
  std::vector<HighsIisInfo,_std::allocator<HighsIisInfo>_>::operator=
            (&iis->info_,&(this->iis_).info_);
  return HVar3;
}

Assistant:

HighsStatus Highs::getIis(HighsIis& iis) {
  if (this->model_status_ == HighsModelStatus::kOptimal ||
      this->model_status_ == HighsModelStatus::kUnbounded) {
    // Strange to call getIis for a model that's known to be feasible
    highsLogUser(
        options_.log_options, HighsLogType::kInfo,
        "Calling Highs::getIis for a model that is known to be feasible\n");
    iis.invalidate();
    // No IIS exists, so validate the empty HighsIis instance
    iis.valid_ = true;
    return HighsStatus::kOk;
  }
  HighsStatus return_status = HighsStatus::kOk;
  if (this->model_status_ != HighsModelStatus::kNotset &&
      this->model_status_ != HighsModelStatus::kInfeasible) {
    return_status = HighsStatus::kWarning;
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Calling Highs::getIis for a model with status %s\n",
                 this->modelStatusToString(this->model_status_).c_str());
  }
  return_status =
      interpretCallStatus(options_.log_options, this->getIisInterface(),
                          return_status, "getIisInterface");
  iis = this->iis_;
  return return_status;
}